

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O3

bool __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ExplicitProducer::
dequeue<CSP_Event>(ExplicitProducer *this,CSP_Event *element)

{
  atomic<unsigned_long> *paVar1;
  string *psVar2;
  __int_type _Var3;
  __int_type _Var4;
  __pointer_type pBVar5;
  Block *pBVar6;
  ulong uVar7;
  
  _Var4 = (this->super_ProducerBase).dequeueOvercommit.super___atomic_base<unsigned_long>._M_i;
  if (0x8000000000000000 <
      (this->super_ProducerBase).dequeueOptimisticCount.super___atomic_base<unsigned_long>._M_i -
      ((this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i + _Var4)) {
    LOCK();
    paVar1 = &(this->super_ProducerBase).dequeueOptimisticCount;
    _Var3 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (0x8000000000000000 <
        _Var3 - (_Var4 + (this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>.
                         _M_i)) {
      LOCK();
      paVar1 = &(this->super_ProducerBase).headIndex;
      uVar7 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      pBVar5 = (this->blockIndex)._M_b._M_p;
      _Var4 = (pBVar5->front).super___atomic_base<unsigned_long>._M_i;
      pBVar6 = pBVar5->entries
               [pBVar5->size - 1 &
                ((uVar7 & 0xffffffffffffffe0) - pBVar5->entries[_Var4].base >> 5) + _Var4].block;
      uVar7 = (ulong)((uint)uVar7 & 0x1f);
      psVar2 = (string *)((long)&pBVar6->field_0 + uVar7 * 0x28);
      std::__cxx11::string::operator=((string *)element,psVar2);
      element->id = *(int *)(psVar2 + 0x20);
      if (*(long **)psVar2 != (long *)((pBVar6->field_0).elements + uVar7 * 0x28 + 0x10)) {
        operator_delete(*(long **)psVar2,
                        *(long *)((pBVar6->field_0).elements + uVar7 * 0x28 + 0x10) + 1);
      }
      pBVar6->emptyFlags[uVar7 ^ 0x1f]._M_base._M_i = true;
      return true;
    }
    LOCK();
    paVar1 = &(this->super_ProducerBase).dequeueOvercommit;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
  }
  return false;
}

Assistant:

bool dequeue(U& element)
        {
            auto tail = this->tailIndex.load(std::memory_order_relaxed);
            auto overcommit = this->dequeueOvercommit.load(std::memory_order_relaxed);
            if (details::circular_less_than<index_t>(this->dequeueOptimisticCount.load(std::memory_order_relaxed) - overcommit, tail)) {
                // Might be something to dequeue, let's give it a try
                
                // Note that this if is purely for performance purposes in the common case when the queue is
                // empty and the values are eventually consistent -- we may enter here spuriously.
                
                // Note that whatever the values of overcommit and tail are, they are not going to change (unless we
                // change them) and must be the same value at this point (inside the if) as when the if condition was
                // evaluated.

                // We insert an acquire fence here to synchronize-with the release upon incrementing dequeueOvercommit below.
                // This ensures that whatever the value we got loaded into overcommit, the load of dequeueOptisticCount in
                // the fetch_add below will result in a value at least as recent as that (and therefore at least as large).
                // Note that I believe a compiler (signal) fence here would be sufficient due to the nature of fetch_add (all
                // read-modify-write operations are guaranteed to work on the latest value in the modification order), but
                // unfortunately that can't be shown to be correct using only the C++11 standard.
                // See http://stackoverflow.com/questions/18223161/what-are-the-c11-memory-ordering-guarantees-in-this-corner-case
                std::atomic_thread_fence(std::memory_order_acquire);
                
                // Increment optimistic counter, then check if it went over the boundary
                auto myDequeueCount = this->dequeueOptimisticCount.fetch_add(1, std::memory_order_relaxed);
                
                // Note that since dequeueOvercommit must be <= dequeueOptimisticCount (because dequeueOvercommit is only ever
                // incremented after dequeueOptimisticCount -- this is enforced in the `else` block below), and since we now
                // have a version of dequeueOptimisticCount that is at least as recent as overcommit (due to the release upon
                // incrementing dequeueOvercommit and the acquire above that synchronizes with it), overcommit <= myDequeueCount.
                // However, we can't assert this since both dequeueOptimisticCount and dequeueOvercommit may (independently)
                // overflow; in such a case, though, the logic still holds since the difference between the two is maintained.
                
                // Note that we reload tail here in case it changed; it will be the same value as before or greater, since
                // this load is sequenced after (happens after) the earlier load above. This is supported by read-read
                // coherency (as defined in the standard), explained here: http://en.cppreference.com/w/cpp/atomic/memory_order
                tail = this->tailIndex.load(std::memory_order_acquire);
                if ((details::likely)(details::circular_less_than<index_t>(myDequeueCount - overcommit, tail))) {
                    // Guaranteed to be at least one element to dequeue!
                    
                    // Get the index. Note that since there's guaranteed to be at least one element, this
                    // will never exceed tail. We need to do an acquire-release fence here since it's possible
                    // that whatever condition got us to this point was for an earlier enqueued element (that
                    // we already see the memory effects for), but that by the time we increment somebody else
                    // has incremented it, and we need to see the memory effects for *that* element, which is
                    // in such a case is necessarily visible on the thread that incremented it in the first
                    // place with the more current condition (they must have acquired a tail that is at least
                    // as recent).
                    auto index = this->headIndex.fetch_add(1, std::memory_order_acq_rel);
                    
                    
                    // Determine which block the element is in
                    
                    auto localBlockIndex = blockIndex.load(std::memory_order_acquire);
                    auto localBlockIndexHead = localBlockIndex->front.load(std::memory_order_acquire);
                    
                    // We need to be careful here about subtracting and dividing because of index wrap-around.
                    // When an index wraps, we need to preserve the sign of the offset when dividing it by the
                    // block size (in order to get a correct signed block count offset in all cases):
                    auto headBase = localBlockIndex->entries[localBlockIndexHead].base;
                    auto blockBaseIndex = index & ~static_cast<index_t>(BLOCK_SIZE - 1);
                    auto offset = static_cast<size_t>(static_cast<typename std::make_signed<index_t>::type>(blockBaseIndex - headBase) / BLOCK_SIZE);
                    auto block = localBlockIndex->entries[(localBlockIndexHead + offset) & (localBlockIndex->size - 1)].block;
                    
                    // Dequeue
                    auto& el = *((*block)[index]);
                    if (!MOODYCAMEL_NOEXCEPT_ASSIGN(T, T&&, element = std::move(el))) {
                        // Make sure the element is still fully dequeued and destroyed even if the assignment
                        // throws
                        struct Guard {
                            Block* block;
                            index_t index;
                            
                            ~Guard()
                            {
                                (*block)[index]->~T();
                                block->ConcurrentQueue::Block::template set_empty<explicit_context>(index);
                            }
                        } guard = { block, index };
                        
                        element = std::move(el);
                    }
                    else {
                        element = std::move(el);
                        el.~T();
                        block->ConcurrentQueue::Block::template set_empty<explicit_context>(index);
                    }
                    
                    return true;
                }
                else {
                    // Wasn't anything to dequeue after all; make the effective dequeue count eventually consistent
                    this->dequeueOvercommit.fetch_add(1, std::memory_order_release);        // Release so that the fetch_add on dequeueOptimisticCount is guaranteed to happen before this write
                }
            }
        
            return false;
        }